

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O1

void ngx_http_upstream_finalize_request(ngx_http_request_t *r,ngx_http_upstream_t *u,ngx_int_t rc)

{
  ngx_peer_connection_t *pnVar1;
  ngx_log_t *pnVar2;
  ngx_resolver_ctx_t *ctx;
  ngx_http_upstream_state_t *pnVar3;
  ngx_event_pipe_t *pnVar4;
  ngx_event_free_peer_pt p_Var5;
  ngx_pool_t *pool;
  ngx_temp_file_t *pnVar6;
  ngx_http_cache_t *pnVar7;
  int iVar8;
  int *piVar9;
  time_t tVar10;
  long lVar11;
  ngx_uint_t flags;
  
  pnVar2 = r->connection->log;
  if ((pnVar2->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2,0,"finalize http upstream request: %i",rc);
  }
  if (u->cleanup == (ngx_http_cleanup_pt *)0x0) {
    lVar11 = -4;
  }
  else {
    *u->cleanup = (ngx_http_cleanup_pt)0x0;
    u->cleanup = (ngx_http_cleanup_pt *)0x0;
    if ((u->resolved != (ngx_http_upstream_resolved_t *)0x0) &&
       (ctx = u->resolved->ctx, ctx != (ngx_resolver_ctx_t *)0x0)) {
      ngx_resolve_name_done(ctx);
      u->resolved->ctx = (ngx_resolver_ctx_t *)0x0;
    }
    pnVar3 = u->state;
    if ((pnVar3 != (ngx_http_upstream_state_t *)0x0) && (pnVar3->response_time != 0)) {
      pnVar3->response_time = ngx_current_msec - pnVar3->response_time;
      pnVar4 = u->pipe;
      if ((pnVar4 != (ngx_event_pipe_t *)0x0) && (lVar11 = pnVar4->read_length, lVar11 != 0)) {
        pnVar3->bytes_received = pnVar3->bytes_received + (lVar11 - pnVar4->preread_size);
        pnVar3->response_length = lVar11;
      }
    }
    (*u->finalize_request)(r,rc);
    pnVar1 = &u->peer;
    p_Var5 = (u->peer).free;
    if ((p_Var5 != (ngx_event_free_peer_pt)0x0) && ((u->peer).sockaddr != (sockaddr *)0x0)) {
      (*p_Var5)(pnVar1,(u->peer).data,0);
      (u->peer).sockaddr = (sockaddr *)0x0;
    }
    if (pnVar1->connection != (ngx_connection_t *)0x0) {
      pnVar2 = r->connection->log;
      if ((pnVar2->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar2,0,"close http upstream connection: %d",
                           (ulong)(uint)pnVar1->connection->fd);
      }
      pool = pnVar1->connection->pool;
      if (pool != (ngx_pool_t *)0x0) {
        ngx_destroy_pool(pool);
      }
      ngx_close_connection(pnVar1->connection);
    }
    (u->peer).connection = (ngx_connection_t *)0x0;
    if (((u->pipe != (ngx_event_pipe_t *)0x0) &&
        (pnVar6 = u->pipe->temp_file, pnVar6 != (ngx_temp_file_t *)0x0)) &&
       (pnVar2 = r->connection->log, (pnVar2->log_level & 0x100) != 0)) {
      ngx_log_error_core(8,pnVar2,0,"http upstream temp fd: %d",(ulong)(uint)(pnVar6->file).fd);
    }
    if (((((u->field_0x3e8 & 1) != 0) && (u->pipe != (ngx_event_pipe_t *)0x0)) &&
        ((pnVar6 = u->pipe->temp_file, pnVar6 != (ngx_temp_file_t *)0x0 &&
         (((pnVar6->file).fd != -1 &&
          (iVar8 = unlink((char *)(pnVar6->file).name.data), iVar8 == -1)))))) &&
       (pnVar2 = r->connection->log, 2 < pnVar2->log_level)) {
      piVar9 = __errno_location();
      ngx_log_error_core(3,pnVar2,*piVar9,"unlink() \"%s\" failed",
                         (u->pipe->temp_file->file).name.data);
    }
    if (r->cache != (ngx_http_cache_t *)0x0) {
      if (((u->field_0x3e8 & 2) != 0) &&
         (((rc == 0x1f8 || (rc == 0x1f6)) &&
          (tVar10 = ngx_http_file_cache_valid(u->conf->cache_valid,rc), tVar10 != 0)))) {
        pnVar7 = r->cache;
        pnVar7->valid_sec = tVar10 + ngx_cached_time->sec;
        pnVar7->error = rc;
      }
      ngx_http_file_cache_free(r->cache,u->pipe->temp_file);
    }
    if (((r->field_0x467 & 8) != 0) && (299 < (u->headers_in).status_n)) {
      (u->buffer).last = (u->buffer).pos;
    }
    r->read_event_handler = ngx_http_block_reading;
    if (rc == -5) {
      return;
    }
    r->connection->log->action = "sending to client";
    lVar11 = rc;
    if ((((*(ushort *)&u->field_0x3e8 >> 0xc & 1) != 0) && (rc != 0x198)) &&
       ((rc != 499 && ((u->pipe == (ngx_event_pipe_t *)0x0 || ((u->pipe->field_0x69 & 2) == 0))))))
    {
      lVar11 = -1;
      if (rc < 300) {
        lVar11 = rc;
      }
      if (((uint)*(ulong *)&r->field_0x468 >> 9 & 1) == 0) {
        if (lVar11 == 0) {
          flags = 1;
        }
        else {
          if (rc < 300) goto LAB_0015157a;
          *(ulong *)&r->field_0x468 = *(ulong *)&r->field_0x468 & 0xfffffffffffff9ff;
          flags = 2;
        }
        lVar11 = ngx_http_send_special(r,flags);
      }
    }
  }
LAB_0015157a:
  ngx_http_finalize_request(r,lVar11);
  return;
}

Assistant:

static void
ngx_http_upstream_finalize_request(ngx_http_request_t *r,
    ngx_http_upstream_t *u, ngx_int_t rc)
{
    ngx_uint_t  flush;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "finalize http upstream request: %i", rc);

    if (u->cleanup == NULL) {
        /* the request was already finalized */
        ngx_http_finalize_request(r, NGX_DONE);
        return;
    }

    *u->cleanup = NULL;
    u->cleanup = NULL;

    if (u->resolved && u->resolved->ctx) {
        ngx_resolve_name_done(u->resolved->ctx);
        u->resolved->ctx = NULL;
    }

    if (u->state && u->state->response_time) {
        u->state->response_time = ngx_current_msec - u->state->response_time;

        if (u->pipe && u->pipe->read_length) {
            u->state->bytes_received += u->pipe->read_length
                                        - u->pipe->preread_size;
            u->state->response_length = u->pipe->read_length;
        }
    }

    u->finalize_request(r, rc);

    if (u->peer.free && u->peer.sockaddr) {
        u->peer.free(&u->peer, u->peer.data, 0);
        u->peer.sockaddr = NULL;
    }

    if (u->peer.connection) {

#if (NGX_HTTP_SSL)

        /* TODO: do not shutdown persistent connection */

        if (u->peer.connection->ssl) {

            /*
             * We send the "close notify" shutdown alert to the upstream only
             * and do not wait its "close notify" shutdown alert.
             * It is acceptable according to the TLS standard.
             */

            u->peer.connection->ssl->no_wait_shutdown = 1;

            (void) ngx_ssl_shutdown(u->peer.connection);
        }
#endif

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "close http upstream connection: %d",
                       u->peer.connection->fd);

        if (u->peer.connection->pool) {
            ngx_destroy_pool(u->peer.connection->pool);
        }

        ngx_close_connection(u->peer.connection);
    }

    u->peer.connection = NULL;

    if (u->pipe && u->pipe->temp_file) {
        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http upstream temp fd: %d",
                       u->pipe->temp_file->file.fd);
    }

    if (u->store && u->pipe && u->pipe->temp_file
        && u->pipe->temp_file->file.fd != NGX_INVALID_FILE)
    {
        if (ngx_delete_file(u->pipe->temp_file->file.name.data)
            == NGX_FILE_ERROR)
        {
            ngx_log_error(NGX_LOG_CRIT, r->connection->log, ngx_errno,
                          ngx_delete_file_n " \"%s\" failed",
                          u->pipe->temp_file->file.name.data);
        }
    }

#if (NGX_HTTP_CACHE)

    if (r->cache) {

        if (u->cacheable) {

            if (rc == NGX_HTTP_BAD_GATEWAY || rc == NGX_HTTP_GATEWAY_TIME_OUT) {
                time_t  valid;

                valid = ngx_http_file_cache_valid(u->conf->cache_valid, rc);

                if (valid) {
                    r->cache->valid_sec = ngx_time() + valid;
                    r->cache->error = rc;
                }
            }
        }

        ngx_http_file_cache_free(r->cache, u->pipe->temp_file);
    }

#endif

    if (r->subrequest_in_memory
        && u->headers_in.status_n >= NGX_HTTP_SPECIAL_RESPONSE)
    {
        u->buffer.last = u->buffer.pos;
    }

    r->read_event_handler = ngx_http_block_reading;

    if (rc == NGX_DECLINED) {
        return;
    }

    r->connection->log->action = "sending to client";

    if (!u->header_sent
        || rc == NGX_HTTP_REQUEST_TIME_OUT
        || rc == NGX_HTTP_CLIENT_CLOSED_REQUEST
        || (u->pipe && u->pipe->downstream_error))
    {
        ngx_http_finalize_request(r, rc);
        return;
    }

    flush = 0;

    if (rc >= NGX_HTTP_SPECIAL_RESPONSE) {
        rc = NGX_ERROR;
        flush = 1;
    }

    if (r->header_only) {
        ngx_http_finalize_request(r, rc);
        return;
    }

    if (rc == 0) {
        rc = ngx_http_send_special(r, NGX_HTTP_LAST);

    } else if (flush) {
        r->keepalive = 0;
        rc = ngx_http_send_special(r, NGX_HTTP_FLUSH);
    }

    ngx_http_finalize_request(r, rc);
}